

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generators.c
# Opt level: O2

void take_gen(void *args0)

{
  int iVar1;
  _Bool _Var2;
  Value v;
  Value VStack_18;
  
  while (iVar1 = *(int *)((long)args0 + 8), *(int *)((long)args0 + 8) = iVar1 + -1, 0 < iVar1) {
    _Var2 = gen_should_finish();
    if (_Var2) break;
    _Var2 = gen_next(*args0,&VStack_18);
    if (!_Var2) break;
    gen_yield(&VStack_18);
  }
  gen_close(*args0);
  return;
}

Assistant:

static void
take_gen(void *args0)
{
    TakeGenArgs *args = (TakeGenArgs *) args0;
    while (args->n-- > 0 && !gen_should_finish()) {
        Value v;
        if (!gen_next(args->source, &v))
            break;
        gen_yield(&v);
    }
    gen_close(args->source);
}